

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

bb_insn_t_conflict get_fake_insn(gen_ctx_t gen_ctx,VARR_bb_insn_t *fake_insns,MIR_reg_t reg)

{
  MIR_context_t ctx_00;
  MIR_type_t type_00;
  MIR_insn_code_t code;
  size_t sVar1;
  MIR_op_t local_b8;
  bb_t_conflict local_80;
  bb_t_conflict bb;
  bb_insn_t_conflict bb_insn;
  MIR_insn_t insn;
  MIR_op_t op;
  MIR_type_t type;
  MIR_context_t ctx;
  MIR_reg_t reg_local;
  VARR_bb_insn_t *fake_insns_local;
  gen_ctx_t gen_ctx_local;
  
  ctx_00 = gen_ctx->ctx;
  local_80 = DLIST_bb_t_head(&gen_ctx->curr_cfg->bbs);
  if (local_80->index != 0) {
    __assert_fail("bb->index == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x897,"bb_insn_t get_fake_insn(gen_ctx_t, VARR_bb_insn_t *, MIR_reg_t)");
  }
  _MIR_new_var_op(&local_b8,ctx_00,reg);
  memcpy(&insn,&local_b8,0x30);
  while( true ) {
    sVar1 = VARR_bb_insn_tlength(fake_insns);
    if (reg < sVar1) break;
    VARR_bb_insn_tpush(fake_insns,(bb_insn_t_conflict)0x0);
  }
  bb = (bb_t_conflict)VARR_bb_insn_tget(fake_insns,(ulong)reg);
  if (bb == (bb_t_conflict)0x0) {
    if (reg < 0x22) {
      __assert_fail("reg > ST1_HARD_REG",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x89b,"bb_insn_t get_fake_insn(gen_ctx_t, VARR_bb_insn_t *, MIR_reg_t)");
    }
    type_00 = MIR_reg_type(ctx_00,reg - 0x21,(gen_ctx->curr_func_item->u).func);
    code = get_move_code(type_00);
    bb_insn = (bb_insn_t_conflict)MIR_new_insn(ctx_00,code);
    bb = (bb_t_conflict)create_bb_insn(gen_ctx,(MIR_insn_t)bb_insn,local_80);
    VARR_bb_insn_tset(fake_insns,(ulong)reg,(bb_insn_t_conflict)bb);
  }
  return (bb_insn_t_conflict)bb;
}

Assistant:

static bb_insn_t get_fake_insn (gen_ctx_t gen_ctx, VARR (bb_insn_t) * fake_insns, MIR_reg_t reg) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_type_t type;
  MIR_op_t op;
  MIR_insn_t insn;
  bb_insn_t bb_insn;
  bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); /* enter bb */

  gen_assert (bb->index == 0); /* enter bb */
  op = _MIR_new_var_op (ctx, reg);
  while (VARR_LENGTH (bb_insn_t, fake_insns) <= reg) VARR_PUSH (bb_insn_t, fake_insns, NULL);
  if ((bb_insn = VARR_GET (bb_insn_t, fake_insns, reg)) == NULL) {
    gen_assert (reg > MAX_HARD_REG);
    type = MIR_reg_type (ctx, reg - MAX_HARD_REG, curr_func_item->u.func);
    insn = MIR_new_insn (ctx, get_move_code (type), op, op);
    bb_insn = create_bb_insn (gen_ctx, insn, bb);
    VARR_SET (bb_insn_t, fake_insns, reg, bb_insn);
  }
  return bb_insn;
}